

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void print_mat(FILE *out,char *indent,m256v *M)

{
  char *pcVar1;
  int c;
  long lVar2;
  int r;
  ulong uVar3;
  
  for (uVar3 = 0; (long)uVar3 < (long)*(int *)indent; uVar3 = uVar3 + 1) {
    pcVar1 = " ";
    if (uVar3 == 0) {
      pcVar1 = "[";
    }
    fprintf((FILE *)out,"%s%s"," ",pcVar1);
    for (lVar2 = 0; lVar2 < *(int *)(indent + 4); lVar2 = lVar2 + 1) {
      fprintf((FILE *)out," %02x",
              (ulong)*(byte *)(lVar2 + *(long *)(indent + 8) * uVar3 + *(long *)(indent + 0x10)));
    }
    pcVar1 = "";
    if (uVar3 == *(int *)indent - 1) {
      pcVar1 = " ]";
    }
    fprintf((FILE *)out,"%s\n",pcVar1);
  }
  return;
}

Assistant:

UNUSED
static void print_mat(FILE* out, const char* indent, const m256v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, " %02x", (int)m256v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}